

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O0

void __thiscall OpenMD::Stats::~Stats(Stats *this)

{
  bool bVar1;
  iterator this_00;
  reference pSVar2;
  __normal_iterator<OpenMD::Stats::StatsData_*,_std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>_>
  *in_RDI;
  StatsData *data;
  iterator __end1;
  iterator __begin1;
  vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_> *__range1;
  BaseAccumulator *in_stack_ffffffffffffffc8;
  __normal_iterator<OpenMD::Stats::StatsData_*,_std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>_>
  local_18;
  __normal_iterator<OpenMD::Stats::StatsData_*,_std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>_>
  *local_10;
  
  in_RDI->_M_current = (StatsData *)&PTR__Stats_00501b38;
  local_10 = in_RDI + 3;
  local_18._M_current =
       (StatsData *)
       std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::begin
                 ((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_> *)
                  in_stack_ffffffffffffffc8);
  this_00 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::end
                      ((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                        *)in_stack_ffffffffffffffc8);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_RDI,(__normal_iterator<OpenMD::Stats::StatsData_*,_std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>_>
                                    *)in_stack_ffffffffffffffc8), bVar1) {
    pSVar2 = __gnu_cxx::
             __normal_iterator<OpenMD::Stats::StatsData_*,_std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>_>
             ::operator*(&local_18);
    bVar1 = std::vector<OpenMD::BaseAccumulator_*,_std::allocator<OpenMD::BaseAccumulator_*>_>::
            empty((vector<OpenMD::BaseAccumulator_*,_std::allocator<OpenMD::BaseAccumulator_*>_> *)
                  this_00._M_current);
    if (bVar1) {
      in_stack_ffffffffffffffc8 = pSVar2->accumulator;
      if (in_stack_ffffffffffffffc8 != (BaseAccumulator *)0x0) {
        (*in_stack_ffffffffffffffc8->_vptr_BaseAccumulator[3])();
      }
    }
    else {
      Utils::
      deletePointers<std::vector<OpenMD::BaseAccumulator*,std::allocator<OpenMD::BaseAccumulator*>>>
                ((vector<OpenMD::BaseAccumulator_*,_std::allocator<OpenMD::BaseAccumulator_*>_> *)
                 this_00._M_current);
    }
    __gnu_cxx::
    __normal_iterator<OpenMD::Stats::StatsData_*,_std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>_>
    ::operator++(&local_18);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Stats::StatsIndex,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Stats::StatsIndex>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Stats::StatsIndex,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Stats::StatsIndex>_>_>
          *)0x37839b);
  std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::~vector
            ((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_> *)
             this_00._M_current);
  return;
}

Assistant:

Stats::~Stats() {
    for (auto& data : data_) {
      if (!data.accumulatorArray2d.empty())
        Utils::deletePointers(data.accumulatorArray2d);
      else
        delete data.accumulator;
    }
  }